

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O0

int hostkey_method_ssh_ecdsa_signv
              (LIBSSH2_SESSION *session,uchar **signature,size_t *signature_len,int veccount,
              iovec *datavec,void **abstract)

{
  EC_KEY *ec_ctx_00;
  libssh2_curve_type lVar1;
  int local_114;
  EVP_MD_CTX *pEStack_110;
  int i_2;
  EVP_MD_CTX *ctx_2;
  uchar hash_2 [64];
  EVP_MD_CTX *pEStack_c0;
  int i_1;
  EVP_MD_CTX *ctx_1;
  uchar hash_1 [48];
  EVP_MD_CTX *pEStack_80;
  int i;
  EVP_MD_CTX *ctx;
  uchar hash [32];
  int local_50;
  int ret;
  libssh2_curve_type type;
  EC_KEY *ec_ctx;
  void **abstract_local;
  iovec *datavec_local;
  int veccount_local;
  size_t *signature_len_local;
  uchar **signature_local;
  LIBSSH2_SESSION *session_local;
  
  ec_ctx_00 = (EC_KEY *)*abstract;
  lVar1 = _libssh2_ecdsa_get_curve_type(ec_ctx_00);
  if (lVar1 == LIBSSH2_EC_CURVE_NISTP256) {
    _libssh2_sha256_init(&stack0xffffffffffffff80);
    hash_1[0x2c] = '\0';
    hash_1[0x2d] = '\0';
    hash_1[0x2e] = '\0';
    hash_1[0x2f] = '\0';
    for (; (int)hash_1._44_4_ < veccount; hash_1._44_4_ = hash_1._44_4_ + 1) {
      EVP_DigestUpdate((EVP_MD_CTX *)pEStack_80,datavec[(int)hash_1._44_4_].iov_base,
                       datavec[(int)hash_1._44_4_].iov_len);
    }
    EVP_DigestFinal((EVP_MD_CTX *)pEStack_80,(uchar *)&ctx,(uint *)0x0);
    EVP_MD_CTX_free((EVP_MD_CTX *)0x1ef03a);
    local_50 = _libssh2_ecdsa_sign(session,ec_ctx_00,(uchar *)&ctx,0x20,signature,signature_len);
  }
  else if (lVar1 == LIBSSH2_EC_CURVE_NISTP384) {
    _libssh2_sha384_init(&stack0xffffffffffffff40);
    hash_2[0x3c] = '\0';
    hash_2[0x3d] = '\0';
    hash_2[0x3e] = '\0';
    hash_2[0x3f] = '\0';
    for (; (int)hash_2._60_4_ < veccount; hash_2._60_4_ = hash_2._60_4_ + 1) {
      EVP_DigestUpdate((EVP_MD_CTX *)pEStack_c0,datavec[(int)hash_2._60_4_].iov_base,
                       datavec[(int)hash_2._60_4_].iov_len);
    }
    EVP_DigestFinal((EVP_MD_CTX *)pEStack_c0,(uchar *)&ctx_1,(uint *)0x0);
    EVP_MD_CTX_free((EVP_MD_CTX *)0x1ef0fb);
    local_50 = _libssh2_ecdsa_sign(session,ec_ctx_00,(uchar *)&ctx_1,0x30,signature,signature_len);
  }
  else {
    if (lVar1 != LIBSSH2_EC_CURVE_NISTP521) {
      return -1;
    }
    _libssh2_sha512_init(&stack0xfffffffffffffef0);
    for (local_114 = 0; local_114 < veccount; local_114 = local_114 + 1) {
      EVP_DigestUpdate((EVP_MD_CTX *)pEStack_110,datavec[local_114].iov_base,
                       datavec[local_114].iov_len);
    }
    EVP_DigestFinal((EVP_MD_CTX *)pEStack_110,(uchar *)&ctx_2,(uint *)0x0);
    EVP_MD_CTX_free((EVP_MD_CTX *)0x1ef1bf);
    local_50 = _libssh2_ecdsa_sign(session,ec_ctx_00,(uchar *)&ctx_2,0x40,signature,signature_len);
  }
  return local_50;
}

Assistant:

static int
hostkey_method_ssh_ecdsa_signv(LIBSSH2_SESSION * session,
                               unsigned char **signature,
                               size_t *signature_len,
                               int veccount,
                               const struct iovec datavec[],
                               void **abstract)
{
    libssh2_ecdsa_ctx *ec_ctx = (libssh2_ecdsa_ctx *) (*abstract);
    libssh2_curve_type type = _libssh2_ecdsa_get_curve_type(ec_ctx);
    int ret = 0;

    if(type == LIBSSH2_EC_CURVE_NISTP256) {
        LIBSSH2_HOSTKEY_METHOD_EC_SIGNV_HASH(256);
    }
    else if(type == LIBSSH2_EC_CURVE_NISTP384) {
        LIBSSH2_HOSTKEY_METHOD_EC_SIGNV_HASH(384);
    }
    else if(type == LIBSSH2_EC_CURVE_NISTP521) {
        LIBSSH2_HOSTKEY_METHOD_EC_SIGNV_HASH(512);
    }
    else {
        return -1;
    }

    return ret;
}